

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O1

void sysbvm_analysisAndEvaluationEnvironment_addUseTupleWithNamedSlotsBinding
               (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t binding)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  
  _Var1 = sysbvm_tuple_isKindOf
                    (context,environment,(context->roots).analysisAndEvaluationEnvironmentType);
  if (!_Var1) {
    sysbvm_error("Expected an analysis and evaluation environment.");
  }
  if (*(long *)(environment + 0x48) == 0) {
    sVar2 = sysbvm_orderedCollection_create(context);
    *(sysbvm_tuple_t *)(environment + 0x48) = sVar2;
  }
  sysbvm_orderedCollection_add(context,*(sysbvm_tuple_t *)(environment + 0x48),binding);
  return;
}

Assistant:

SYSBVM_API void sysbvm_analysisAndEvaluationEnvironment_addUseTupleWithNamedSlotsBinding(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t binding)
{
    if(!sysbvm_environment_isAnalysisAndEvaluationEnvironment(context, environment))
        sysbvm_error("Expected an analysis and evaluation environment.");

    sysbvm_analysisAndEvaluationEnvironment_t *environmentObject = (sysbvm_analysisAndEvaluationEnvironment_t*)environment;
    if(!environmentObject->usedTuplesWithNamedSlots)
        environmentObject->usedTuplesWithNamedSlots = sysbvm_orderedCollection_create(context);
    sysbvm_orderedCollection_add(context, environmentObject->usedTuplesWithNamedSlots, binding);
}